

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::GetEnv(VirtualMachine *this)

{
  element_type *peVar1;
  char *pcVar2;
  string *val;
  Variable VVar3;
  
  VVar3 = popOpStack(this);
  if (VVar3.type == String) {
    pcVar2 = getenv((char *)((VVar3.field_1.objectValue)->properties)._M_h._M_buckets);
    if (pcVar2 != (char *)0x0) {
      val = Heap::NewString_abi_cxx11_(&this->heap);
      val->_M_string_length = 0;
      *(val->_M_dataplus)._M_p = '\0';
      std::__cxx11::string::assign((char *)val);
      pushString(this,val);
      goto LAB_00117a98;
    }
  }
  pushUndefined(this);
LAB_00117a98:
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::GetEnv() {
  Variable first = this->popOpStack();

  if (first.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  auto getEnvVal = std::getenv(first.stringValue->c_str());

  if (getEnvVal == nullptr) {
    this->pushUndefined();

  } else {
    std::string* newString = this->heap.NewString();
    newString->clear();
    newString->assign(getEnvVal);
    this->pushString(newString);
  }

  this->advance();
}